

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-s-parser.cpp
# Opt level: O3

void __thiscall wasm::SExpressionWasmBuilder::parseExport(SExpressionWasmBuilder *this,Element *s)

{
  bool bVar1;
  Export *curr;
  Element *pEVar2;
  Element *this_00;
  Export *pEVar3;
  string *psVar4;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  IString str;
  IString str_00;
  IString str_01;
  string_view sVar5;
  IString IVar6;
  undefined1 *local_88;
  long local_80;
  undefined1 local_78 [16];
  undefined1 *local_68;
  long local_60;
  undefined1 local_58 [16];
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  curr = (Export *)operator_new(0x28);
  (curr->name).super_IString.str._M_len = 0;
  (curr->name).super_IString.str._M_str = (char *)0x0;
  (curr->value).super_IString.str._M_len = 0;
  (curr->value).super_IString.str._M_str = (char *)0x0;
  *(undefined8 *)&curr->kind = 0;
  pEVar2 = Element::operator[](s,1);
  sVar5 = (string_view)Element::str(pEVar2);
  (curr->name).super_IString.str = sVar5;
  pEVar2 = Element::operator[](s,2);
  if (pEVar2->isList_ == true) {
    pEVar2 = Element::operator[](s,2);
    IVar6.str._M_str = extraout_RDX;
    IVar6.str._M_len = DAT_00da7e80;
    bVar1 = elementStartsWith(pEVar2,IVar6);
    if (bVar1) {
      curr->kind = Function;
      pEVar2 = Element::operator[](pEVar2,1);
      sVar5 = (string_view)getFunctionName(this,pEVar2);
    }
    else {
      str.str._M_str = extraout_RDX_00;
      str.str._M_len = DAT_00da7eb0;
      bVar1 = elementStartsWith(pEVar2,str);
      if (bVar1) {
        curr->kind = Memory;
        pEVar2 = Element::operator[](pEVar2,1);
        sVar5 = (string_view)Element::str(pEVar2);
      }
      else {
        str_00.str._M_str = extraout_RDX_01;
        str_00.str._M_len = DAT_00da7f00;
        bVar1 = elementStartsWith(pEVar2,str_00);
        if (bVar1) {
          curr->kind = Table;
          pEVar2 = Element::operator[](pEVar2,1);
          sVar5 = (string_view)getTableName(this,pEVar2);
        }
        else {
          str_01.str._M_str = extraout_RDX_02;
          str_01.str._M_len = DAT_00da7e70;
          bVar1 = elementStartsWith(pEVar2,str_01);
          if (bVar1) {
            curr->kind = Global;
            pEVar2 = Element::operator[](pEVar2,1);
            sVar5 = (string_view)getGlobalName(this,pEVar2);
          }
          else {
            this_00 = Element::operator[](pEVar2,0);
            IVar6 = Element::str(this_00);
            if (IVar6.str._M_str != DAT_00da80d0) {
              psVar4 = (string *)__cxa_allocate_exception(0x30);
              local_88 = local_78;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_88,"invalid export","");
              local_48 = (undefined4)pEVar2->line;
              uStack_44 = *(undefined4 *)((long)&pEVar2->line + 4);
              uStack_40 = (undefined4)pEVar2->col;
              uStack_3c = *(undefined4 *)((long)&pEVar2->col + 4);
              *(string **)psVar4 = psVar4 + 0x10;
              std::__cxx11::string::_M_construct<char*>(psVar4,local_88,local_88 + local_80);
              *(undefined4 *)(psVar4 + 0x20) = local_48;
              *(undefined4 *)(psVar4 + 0x24) = uStack_44;
              *(undefined4 *)(psVar4 + 0x28) = uStack_40;
              *(undefined4 *)(psVar4 + 0x2c) = uStack_3c;
              __cxa_throw(psVar4,&ParseException::typeinfo,ParseException::~ParseException);
            }
            curr->kind = Tag;
            pEVar2 = Element::operator[](pEVar2,1);
            sVar5 = (string_view)getTagName(this,pEVar2);
          }
        }
      }
    }
    (curr->value).super_IString.str = sVar5;
  }
  else {
    pEVar2 = Element::operator[](s,2);
    sVar5 = (string_view)Element::str(pEVar2);
    (curr->value).super_IString.str = sVar5;
    curr->kind = Function;
  }
  pEVar3 = Module::getExportOrNull(this->wasm,(Name)(curr->name).super_IString.str);
  if (pEVar3 == (Export *)0x0) {
    Module::addExport(this->wasm,curr);
    return;
  }
  psVar4 = (string *)__cxa_allocate_exception(0x30);
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"duplicate export","");
  local_48 = (undefined4)s->line;
  uStack_44 = *(undefined4 *)((long)&s->line + 4);
  uStack_40 = (undefined4)s->col;
  uStack_3c = *(undefined4 *)((long)&s->col + 4);
  *(string **)psVar4 = psVar4 + 0x10;
  std::__cxx11::string::_M_construct<char*>(psVar4,local_68,local_68 + local_60);
  *(undefined4 *)(psVar4 + 0x20) = local_48;
  *(undefined4 *)(psVar4 + 0x24) = uStack_44;
  *(undefined4 *)(psVar4 + 0x28) = uStack_40;
  *(undefined4 *)(psVar4 + 0x2c) = uStack_3c;
  __cxa_throw(psVar4,&ParseException::typeinfo,ParseException::~ParseException);
}

Assistant:

void SExpressionWasmBuilder::parseExport(Element& s) {
  std::unique_ptr<Export> ex = std::make_unique<Export>();
  ex->name = s[1]->str();
  if (s[2]->isList()) {
    auto& inner = *s[2];
    if (elementStartsWith(inner, FUNC)) {
      ex->kind = ExternalKind::Function;
      ex->value = getFunctionName(*inner[1]);
    } else if (elementStartsWith(inner, MEMORY)) {
      ex->kind = ExternalKind::Memory;
      ex->value = inner[1]->str();
    } else if (elementStartsWith(inner, TABLE)) {
      ex->kind = ExternalKind::Table;
      ex->value = getTableName(*inner[1]);
    } else if (elementStartsWith(inner, GLOBAL)) {
      ex->kind = ExternalKind::Global;
      ex->value = getGlobalName(*inner[1]);
    } else if (inner[0]->str() == TAG) {
      ex->kind = ExternalKind::Tag;
      ex->value = getTagName(*inner[1]);
    } else {
      throw ParseException("invalid export", inner.line, inner.col);
    }
  } else {
    // function
    ex->value = s[2]->str();
    ex->kind = ExternalKind::Function;
  }
  if (wasm.getExportOrNull(ex->name)) {
    throw ParseException("duplicate export", s.line, s.col);
  }
  wasm.addExport(ex.release());
}